

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poledf.cc
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  byte bVar3;
  undefined1 uVar4;
  ostream *poVar5;
  InputSourcePreprocessingForFilterGain *this;
  long in_RSI;
  int in_EDI;
  ostringstream error_message_12;
  ostringstream error_message_11;
  ostringstream error_message_10;
  double signal;
  ostringstream error_message_9;
  Buffer buffer;
  AllPoleDigitalFilter filter;
  ostringstream error_message_8;
  InputSourcePreprocessingForFilterGain preprocessing;
  FilterGainType gain_type;
  InputSourceInterpolation interpolation;
  InputSourceFromStream input_source;
  vector<double,_std::allocator<double>_> filter_coefficients;
  int filter_length;
  istream *stream_for_filter_input;
  ostringstream error_message_7;
  ifstream ifs2;
  istream *stream_for_filter_coefficients;
  ostringstream error_message_6;
  ifstream ifs1;
  ostringstream error_message_5;
  ostringstream error_message_4;
  int num_input_files;
  char *filter_input_file;
  char *filter_coefficients_file;
  ostringstream error_message_3;
  ostringstream error_message_2;
  ostringstream error_message_1;
  ostringstream error_message;
  int option_char;
  bool gain_flag;
  bool transposition_flag;
  int interpolation_period;
  int frame_period;
  int num_filter_order;
  option *in_stack_ffffffffffffe348;
  allocator *paVar6;
  undefined7 in_stack_ffffffffffffe350;
  undefined1 in_stack_ffffffffffffe357;
  string *in_stack_ffffffffffffe358;
  undefined4 in_stack_ffffffffffffe360;
  int in_stack_ffffffffffffe364;
  AllPoleDigitalFilter *in_stack_ffffffffffffe368;
  undefined6 in_stack_ffffffffffffe370;
  undefined1 in_stack_ffffffffffffe376;
  undefined1 in_stack_ffffffffffffe377;
  undefined7 in_stack_ffffffffffffe390;
  undefined1 in_stack_ffffffffffffe397;
  InputSourceInterface *source;
  undefined8 in_stack_ffffffffffffe3b8;
  InputSourceInterpolation *in_stack_ffffffffffffe3c0;
  bool local_1ba2;
  bool local_1b7a;
  bool local_1b4a;
  allocator local_1b29;
  string local_1b28 [32];
  ostringstream local_1b08 [64];
  ostringstream *in_stack_ffffffffffffe538;
  string *in_stack_ffffffffffffe540;
  allocator local_1989;
  string local_1988 [32];
  ostringstream local_1968 [383];
  allocator local_17e9;
  string local_17e8 [32];
  ostringstream local_17c8 [391];
  allocator local_1641;
  string local_1640 [32];
  ostringstream local_1620 [408];
  AllPoleDigitalFilter local_1488;
  allocator local_1471;
  string local_1470 [32];
  ostringstream local_1450 [376];
  InputSourcePreprocessingForFilterGain local_12d8;
  int local_12b4;
  int local_11ec;
  InputSourceInterface *local_11e8;
  allocator local_11d9;
  string local_11d8 [32];
  ostringstream local_11b8 [376];
  InputSourceInterface local_1040 [65];
  char *local_e38;
  undefined4 local_e30;
  allocator local_e29;
  string local_e28 [32];
  ostringstream local_e08 [376];
  char local_c90 [527];
  allocator local_a81;
  string local_a80 [32];
  ostringstream local_a60 [383];
  allocator local_8e1;
  string local_8e0 [32];
  ostringstream local_8c0 [380];
  int local_744;
  char *local_740;
  char *local_738;
  allocator local_729;
  string local_728 [32];
  ostringstream local_708 [383];
  allocator local_589;
  string local_588 [32];
  ostringstream local_568 [383];
  allocator local_3e9;
  string local_3e8 [39];
  allocator local_3c1;
  string local_3c0 [32];
  ostringstream local_3a0 [383];
  allocator local_221;
  string local_220 [39];
  allocator local_1f9;
  string local_1f8 [32];
  ostringstream local_1d8 [399];
  allocator local_49;
  string local_48 [36];
  int local_24;
  byte local_1e;
  byte local_1d;
  int local_1c;
  int local_18;
  int local_14;
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_14 = 0x19;
  local_18 = 100;
  local_1c = 1;
  local_1d = 0;
  local_1e = 1;
  local_10 = in_RSI;
  local_8 = in_EDI;
  while (local_24 = ya_getopt_long(in_stack_ffffffffffffe364,(char **)in_stack_ffffffffffffe358,
                                   (char *)CONCAT17(in_stack_ffffffffffffe357,
                                                    in_stack_ffffffffffffe350),
                                   in_stack_ffffffffffffe348,(int *)0x1037e5), pcVar1 = ya_optarg,
        local_24 != -1) {
    switch(local_24) {
    case 0x68:
      anon_unknown.dwarf_1733::PrintUsage
                ((ostream *)CONCAT17(in_stack_ffffffffffffe397,in_stack_ffffffffffffe390));
      return 0;
    case 0x69:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3e8,pcVar1,&local_3e9);
      bVar2 = sptk::ConvertStringToInteger
                        (in_stack_ffffffffffffe358,
                         (int *)CONCAT17(in_stack_ffffffffffffe357,in_stack_ffffffffffffe350));
      local_1ba2 = !bVar2 || local_1c < 0;
      std::__cxx11::string::~string(local_3e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
      if (local_1ba2) {
        std::__cxx11::ostringstream::ostringstream(local_568);
        poVar5 = std::operator<<((ostream *)local_568,"The argument for the -i option must be a ");
        std::operator<<(poVar5,"non-negative integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_588,"poledf",&local_589);
        sptk::PrintErrorMessage(in_stack_ffffffffffffe540,in_stack_ffffffffffffe538);
        std::__cxx11::string::~string(local_588);
        std::allocator<char>::~allocator((allocator<char> *)&local_589);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_568);
        return local_4;
      }
      break;
    default:
      anon_unknown.dwarf_1733::PrintUsage
                ((ostream *)CONCAT17(in_stack_ffffffffffffe397,in_stack_ffffffffffffe390));
      return 1;
    case 0x6b:
      local_1e = 0;
      break;
    case 0x6d:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_48,pcVar1,&local_49);
      bVar2 = sptk::ConvertStringToInteger
                        (in_stack_ffffffffffffe358,
                         (int *)CONCAT17(in_stack_ffffffffffffe357,in_stack_ffffffffffffe350));
      local_1b4a = !bVar2 || local_14 < 0;
      std::__cxx11::string::~string(local_48);
      std::allocator<char>::~allocator((allocator<char> *)&local_49);
      if (local_1b4a) {
        std::__cxx11::ostringstream::ostringstream(local_1d8);
        poVar5 = std::operator<<((ostream *)local_1d8,"The argument for the -m option must be a ");
        std::operator<<(poVar5,"non-negative integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1f8,"poledf",&local_1f9);
        sptk::PrintErrorMessage(in_stack_ffffffffffffe540,in_stack_ffffffffffffe538);
        std::__cxx11::string::~string(local_1f8);
        std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_1d8);
        return local_4;
      }
      break;
    case 0x70:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_220,pcVar1,&local_221);
      bVar2 = sptk::ConvertStringToInteger
                        (in_stack_ffffffffffffe358,
                         (int *)CONCAT17(in_stack_ffffffffffffe357,in_stack_ffffffffffffe350));
      local_1b7a = !bVar2 || local_18 < 1;
      std::__cxx11::string::~string(local_220);
      std::allocator<char>::~allocator((allocator<char> *)&local_221);
      if (local_1b7a) {
        std::__cxx11::ostringstream::ostringstream(local_3a0);
        std::operator<<((ostream *)local_3a0,
                        "The argument for the -p option must be a positive integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_3c0,"poledf",&local_3c1);
        sptk::PrintErrorMessage(in_stack_ffffffffffffe540,in_stack_ffffffffffffe538);
        std::__cxx11::string::~string(local_3c0);
        std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_3a0);
        return local_4;
      }
      break;
    case 0x74:
      local_1d = 1;
    }
  }
  if (local_18 / 2 < local_1c) {
    std::__cxx11::ostringstream::ostringstream(local_708);
    poVar5 = std::operator<<((ostream *)local_708,
                             "Interpolation period must be equal to or less than half ");
    std::operator<<(poVar5,"frame period");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_728,"poledf",&local_729);
    sptk::PrintErrorMessage(in_stack_ffffffffffffe540,in_stack_ffffffffffffe538);
    std::__cxx11::string::~string(local_728);
    std::allocator<char>::~allocator((allocator<char> *)&local_729);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_708);
    return local_4;
  }
  local_744 = local_8 - ya_optind;
  if (local_744 == 2) {
    local_738 = *(char **)(local_10 + (long)(local_8 + -2) * 8);
    local_740 = *(char **)(local_10 + (long)(local_8 + -1) * 8);
  }
  else {
    if (local_744 != 1) {
      std::__cxx11::ostringstream::ostringstream(local_8c0);
      std::operator<<((ostream *)local_8c0,"Just two input files, afile and infile, are required");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_8e0,"poledf",&local_8e1);
      sptk::PrintErrorMessage(in_stack_ffffffffffffe540,in_stack_ffffffffffffe538);
      std::__cxx11::string::~string(local_8e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_8e1);
      local_4 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_8c0);
      return local_4;
    }
    local_738 = *(char **)(local_10 + (long)(local_8 + -1) * 8);
    local_740 = (char *)0x0;
  }
  bVar2 = sptk::SetBinaryMode();
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_a60);
    std::operator<<((ostream *)local_a60,"Cannot set translation mode");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a80,"poledf",&local_a81);
    sptk::PrintErrorMessage(in_stack_ffffffffffffe540,in_stack_ffffffffffffe538);
    std::__cxx11::string::~string(local_a80);
    std::allocator<char>::~allocator((allocator<char> *)&local_a81);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_a60);
    return local_4;
  }
  std::ifstream::ifstream(local_c90);
  pcVar1 = local_738;
  std::operator|(_S_in,_S_bin);
  std::ifstream::open(local_c90,(_Ios_Openmode)pcVar1);
  bVar3 = std::ios::fail();
  if ((bVar3 & 1) != 0) {
    std::__cxx11::ostringstream::ostringstream(local_e08);
    poVar5 = std::operator<<((ostream *)local_e08,"Cannot open file ");
    std::operator<<(poVar5,local_738);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e28,"poledf",&local_e29);
    sptk::PrintErrorMessage(in_stack_ffffffffffffe540,in_stack_ffffffffffffe538);
    std::__cxx11::string::~string(local_e28);
    std::allocator<char>::~allocator((allocator<char> *)&local_e29);
    local_4 = 1;
    local_e30 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_e08);
    goto LAB_00105095;
  }
  local_e38 = local_c90;
  std::ifstream::ifstream(local_1040);
  pcVar1 = local_740;
  if (local_740 == (char *)0x0) {
LAB_00104748:
    bVar3 = std::ifstream::is_open();
    if ((bVar3 & 1) == 0) {
      source = (InputSourceInterface *)&std::cin;
    }
    else {
      source = local_1040;
    }
    local_11ec = local_14 + 1;
    this = (InputSourcePreprocessingForFilterGain *)(long)local_11ec;
    local_11e8 = source;
    std::allocator<double>::allocator((allocator<double> *)0x1047be);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)
               CONCAT17(in_stack_ffffffffffffe377,
                        CONCAT16(in_stack_ffffffffffffe376,in_stack_ffffffffffffe370)),
               (size_type)in_stack_ffffffffffffe368,
               (allocator_type *)CONCAT44(in_stack_ffffffffffffe364,in_stack_ffffffffffffe360));
    std::allocator<double>::~allocator((allocator<double> *)0x1047e4);
    sptk::InputSourceFromStream::InputSourceFromStream
              ((InputSourceFromStream *)
               CONCAT44(in_stack_ffffffffffffe364,in_stack_ffffffffffffe360),
               SUB81((ulong)in_stack_ffffffffffffe358 >> 0x38,0),(int)in_stack_ffffffffffffe358,
               (istream *)CONCAT17(in_stack_ffffffffffffe357,in_stack_ffffffffffffe350));
    sptk::InputSourceInterpolation::InputSourceInterpolation
              (in_stack_ffffffffffffe3c0,(int)((ulong)in_stack_ffffffffffffe3b8 >> 0x20),
               (int)in_stack_ffffffffffffe3b8,(bool)bVar3,source);
    local_12b4 = ((byte)~local_1e & 1) * 3;
    sptk::InputSourcePreprocessingForFilterGain::InputSourcePreprocessingForFilterGain
              ((InputSourcePreprocessingForFilterGain *)
               CONCAT17(in_stack_ffffffffffffe377,
                        CONCAT16(in_stack_ffffffffffffe376,in_stack_ffffffffffffe370)),
               (FilterGainType)((ulong)in_stack_ffffffffffffe368 >> 0x20),
               (InputSourceInterface *)CONCAT44(in_stack_ffffffffffffe364,in_stack_ffffffffffffe360)
              );
    uVar4 = sptk::InputSourcePreprocessingForFilterGain::IsValid(&local_12d8);
    if ((bool)uVar4) {
      sptk::AllPoleDigitalFilter::AllPoleDigitalFilter(&local_1488,local_14,(bool)(local_1d & 1));
      sptk::AllPoleDigitalFilter::Buffer::Buffer((Buffer *)0x104a57);
      bVar2 = sptk::AllPoleDigitalFilter::IsValid(&local_1488);
      if (bVar2) {
        do {
          bVar2 = sptk::ReadStream<double>
                            ((double *)in_stack_ffffffffffffe358,
                             (istream *)
                             CONCAT17(in_stack_ffffffffffffe357,in_stack_ffffffffffffe350));
          if (!bVar2) {
            local_4 = 0;
            local_e30 = 1;
            goto LAB_00104fd3;
          }
          bVar2 = sptk::InputSourcePreprocessingForFilterGain::Get
                            (this,(vector<double,_std::allocator<double>_> *)
                                  CONCAT17(uVar4,in_stack_ffffffffffffe390));
          if (!bVar2) {
            std::__cxx11::ostringstream::ostringstream(local_17c8);
            std::operator<<((ostream *)local_17c8,"Cannot get filter coefficients");
            paVar6 = &local_17e9;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_17e8,"poledf",paVar6);
            sptk::PrintErrorMessage(in_stack_ffffffffffffe540,in_stack_ffffffffffffe538);
            std::__cxx11::string::~string(local_17e8);
            std::allocator<char>::~allocator((allocator<char> *)&local_17e9);
            local_4 = 1;
            local_e30 = 1;
            std::__cxx11::ostringstream::~ostringstream(local_17c8);
            goto LAB_00104fd3;
          }
          bVar2 = sptk::AllPoleDigitalFilter::Run
                            (in_stack_ffffffffffffe368,
                             (vector<double,_std::allocator<double>_> *)
                             CONCAT44(in_stack_ffffffffffffe364,in_stack_ffffffffffffe360),
                             (double *)in_stack_ffffffffffffe358,
                             (Buffer *)CONCAT17(in_stack_ffffffffffffe357,in_stack_ffffffffffffe350)
                            );
          in_stack_ffffffffffffe364 = CONCAT13(bVar2,(int3)in_stack_ffffffffffffe364);
          if (!bVar2) {
            std::__cxx11::ostringstream::ostringstream(local_1968);
            std::operator<<((ostream *)local_1968,"Failed to apply all-pole digital filter");
            paVar6 = &local_1989;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_1988,"poledf",paVar6);
            sptk::PrintErrorMessage(in_stack_ffffffffffffe540,in_stack_ffffffffffffe538);
            std::__cxx11::string::~string(local_1988);
            std::allocator<char>::~allocator((allocator<char> *)&local_1989);
            local_4 = 1;
            local_e30 = 1;
            std::__cxx11::ostringstream::~ostringstream(local_1968);
            goto LAB_00104fd3;
          }
          in_stack_ffffffffffffe357 =
               sptk::WriteStream<double>((double)in_stack_ffffffffffffe348,(ostream *)0x104e92);
        } while ((bool)in_stack_ffffffffffffe357);
        std::__cxx11::ostringstream::ostringstream(local_1b08);
        std::operator<<((ostream *)local_1b08,"Failed to write a filter output");
        paVar6 = &local_1b29;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1b28,"poledf",paVar6);
        sptk::PrintErrorMessage(in_stack_ffffffffffffe540,in_stack_ffffffffffffe538);
        std::__cxx11::string::~string(local_1b28);
        std::allocator<char>::~allocator((allocator<char> *)&local_1b29);
        local_4 = 1;
        local_e30 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_1b08);
      }
      else {
        std::__cxx11::ostringstream::ostringstream(local_1620);
        std::operator<<((ostream *)local_1620,"Failed to initialize AllPoleDigitalFilter");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1640,"poledf",&local_1641);
        sptk::PrintErrorMessage(in_stack_ffffffffffffe540,in_stack_ffffffffffffe538);
        std::__cxx11::string::~string(local_1640);
        std::allocator<char>::~allocator((allocator<char> *)&local_1641);
        local_4 = 1;
        local_e30 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_1620);
      }
LAB_00104fd3:
      sptk::AllPoleDigitalFilter::Buffer::~Buffer((Buffer *)0x104fe0);
      sptk::AllPoleDigitalFilter::~AllPoleDigitalFilter(&local_1488);
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_1450);
      std::operator<<((ostream *)local_1450,"Failed to initialize InputSource");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1470,"poledf",&local_1471);
      sptk::PrintErrorMessage(in_stack_ffffffffffffe540,in_stack_ffffffffffffe538);
      std::__cxx11::string::~string(local_1470);
      std::allocator<char>::~allocator((allocator<char> *)&local_1471);
      local_4 = 1;
      local_e30 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_1450);
    }
    sptk::InputSourcePreprocessingForFilterGain::~InputSourcePreprocessingForFilterGain
              ((InputSourcePreprocessingForFilterGain *)0x105018);
    sptk::InputSourceInterpolation::~InputSourceInterpolation
              ((InputSourceInterpolation *)
               CONCAT17(in_stack_ffffffffffffe357,in_stack_ffffffffffffe350));
    sptk::InputSourceFromStream::~InputSourceFromStream((InputSourceFromStream *)0x105032);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_ffffffffffffe364,in_stack_ffffffffffffe360));
  }
  else {
    std::operator|(_S_in,_S_bin);
    std::ifstream::open((char *)local_1040,(_Ios_Openmode)pcVar1);
    bVar3 = std::ios::fail();
    if ((bVar3 & 1) == 0) goto LAB_00104748;
    std::__cxx11::ostringstream::ostringstream(local_11b8);
    poVar5 = std::operator<<((ostream *)local_11b8,"Cannot open file ");
    std::operator<<(poVar5,local_740);
    paVar6 = &local_11d9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_11d8,"poledf",paVar6);
    sptk::PrintErrorMessage(in_stack_ffffffffffffe540,in_stack_ffffffffffffe538);
    std::__cxx11::string::~string(local_11d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_11d9);
    local_4 = 1;
    local_e30 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_11b8);
  }
  std::ifstream::~ifstream(local_1040);
LAB_00105095:
  std::ifstream::~ifstream(local_c90);
  return local_4;
}

Assistant:

int main(int argc, char* argv[]) {
  int num_filter_order(kDefaultNumFilterOrder);
  int frame_period(kDefaultFramePeriod);
  int interpolation_period(kDefaultInterpolationPeriod);
  bool transposition_flag(kDefaultTranspositionFlag);
  bool gain_flag(kDefaultGainFlag);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "m:p:i:tkh", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_filter_order) ||
            num_filter_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("poledf", error_message);
          return 1;
        }
        break;
      }
      case 'p': {
        if (!sptk::ConvertStringToInteger(optarg, &frame_period) ||
            frame_period <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -p option must be a positive integer";
          sptk::PrintErrorMessage("poledf", error_message);
          return 1;
        }
        break;
      }
      case 'i': {
        if (!sptk::ConvertStringToInteger(optarg, &interpolation_period) ||
            interpolation_period < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -i option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("poledf", error_message);
          return 1;
        }
        break;
      }
      case 't': {
        transposition_flag = true;
        break;
      }
      case 'k': {
        gain_flag = false;
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  if (frame_period / 2 < interpolation_period) {
    std::ostringstream error_message;
    error_message << "Interpolation period must be equal to or less than half "
                  << "frame period";
    sptk::PrintErrorMessage("poledf", error_message);
    return 1;
  }

  // Get input file names.
  const char* filter_coefficients_file;
  const char* filter_input_file;
  const int num_input_files(argc - optind);
  if (2 == num_input_files) {
    filter_coefficients_file = argv[argc - 2];
    filter_input_file = argv[argc - 1];
  } else if (1 == num_input_files) {
    filter_coefficients_file = argv[argc - 1];
    filter_input_file = NULL;
  } else {
    std::ostringstream error_message;
    error_message << "Just two input files, afile and infile, are required";
    sptk::PrintErrorMessage("poledf", error_message);
    return 1;
  }

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("poledf", error_message);
    return 1;
  }

  // Open stream for reading filter coefficients.
  std::ifstream ifs1;
  ifs1.open(filter_coefficients_file, std::ios::in | std::ios::binary);
  if (ifs1.fail()) {
    std::ostringstream error_message;
    error_message << "Cannot open file " << filter_coefficients_file;
    sptk::PrintErrorMessage("poledf", error_message);
    return 1;
  }
  std::istream& stream_for_filter_coefficients(ifs1);

  // Open stream for reading input signals.
  std::ifstream ifs2;
  if (NULL != filter_input_file) {
    ifs2.open(filter_input_file, std::ios::in | std::ios::binary);
    if (ifs2.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << filter_input_file;
      sptk::PrintErrorMessage("poledf", error_message);
      return 1;
    }
  }
  std::istream& stream_for_filter_input(ifs2.is_open() ? ifs2 : std::cin);

  // Prepare variables for filtering.
  const int filter_length(num_filter_order + 1);
  std::vector<double> filter_coefficients(filter_length);
  sptk::InputSourceFromStream input_source(false, filter_length,
                                           &stream_for_filter_coefficients);
  sptk::InputSourceInterpolation interpolation(
      frame_period, interpolation_period, true, &input_source);
  const sptk::InputSourcePreprocessingForFilterGain::FilterGainType gain_type(
      gain_flag
          ? sptk::InputSourcePreprocessingForFilterGain::FilterGainType::kLinear
          : sptk::InputSourcePreprocessingForFilterGain::FilterGainType::
                kUnity);
  sptk::InputSourcePreprocessingForFilterGain preprocessing(gain_type,
                                                            &interpolation);
  if (!preprocessing.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize InputSource";
    sptk::PrintErrorMessage("poledf", error_message);
    return 1;
  }

  sptk::AllPoleDigitalFilter filter(num_filter_order, transposition_flag);
  sptk::AllPoleDigitalFilter::Buffer buffer;
  if (!filter.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize AllPoleDigitalFilter";
    sptk::PrintErrorMessage("poledf", error_message);
    return 1;
  }

  double signal;

  while (sptk::ReadStream(&signal, &stream_for_filter_input)) {
    if (!preprocessing.Get(&filter_coefficients)) {
      std::ostringstream error_message;
      error_message << "Cannot get filter coefficients";
      sptk::PrintErrorMessage("poledf", error_message);
      return 1;
    }

    if (!filter.Run(filter_coefficients, &signal, &buffer)) {
      std::ostringstream error_message;
      error_message << "Failed to apply all-pole digital filter";
      sptk::PrintErrorMessage("poledf", error_message);
      return 1;
    }

    if (!sptk::WriteStream(signal, &std::cout)) {
      std::ostringstream error_message;
      error_message << "Failed to write a filter output";
      sptk::PrintErrorMessage("poledf", error_message);
      return 1;
    }
  }

  return 0;
}